

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O3

void __thiscall Image_GetSetY_Test::TestBody(Image_GetSetY_Test *this)

{
  Point2i p;
  PixelFormat format;
  undefined8 uVar1;
  undefined1 auVar2 [16];
  Allocator alloc;
  long lVar3;
  int y;
  long lVar4;
  char *pcVar5;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar6;
  ColorEncodingHandle *encoding;
  long lVar7;
  int x;
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar8;
  long lVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  Float FVar12;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_00;
  AssertionResult gtest_ar__1;
  Float v;
  AssertionResult gtest_ar_;
  ImageChannelValues cv;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> yPixels;
  ImageChannelDesc yDesc;
  Image image;
  long *local_260;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_258;
  AssertHelper local_250;
  Float local_244;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> local_240;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> local_210;
  long local_1e0;
  PixelFormat local_1d4;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_1d0;
  ImageChannelDesc local_1b0;
  long local_180;
  long local_178;
  long local_170;
  long local_168;
  ColorEncodingHandle local_160;
  PixelFormat local_154 [3];
  Image local_148;
  
  GetFloatPixels(&local_1d0,(Point2i)0x300000009,1);
  local_154[0] = U256;
  local_154[1] = Half;
  lVar3 = 0;
  local_154[2] = 2;
  do {
    paVar8 = &local_1b0.offset.field_2;
    format = *(PixelFormat *)((long)local_154 + lVar3);
    local_1b0.offset.alloc.memoryResource = (memory_resource *)paVar8;
    local_178 = lVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"Y","");
    local_160.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )pbrt::ColorEncodingHandle::Linear.bits;
    alloc.memoryResource = pstd::pmr::new_delete_resource();
    encoding = &local_160;
    channels.n = 1;
    channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b0;
    pbrt::Image::Image(&local_148,format,(Point2i)0x300000009,channels,encoding,alloc);
    local_1d4 = format;
    if ((anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
         *)local_1b0.offset.alloc.memoryResource != paVar8) {
      operator_delete(local_1b0.offset.alloc.memoryResource,local_1b0.offset.field_2._0_8_ + 1);
    }
    lVar3 = 0;
    lVar7 = 0;
    lVar4 = 0;
    do {
      lVar9 = 0;
      do {
        pbrt::Image::SetChannel
                  (&local_148,(Point2i)(lVar3 + lVar9),0,
                   *(Float *)((long)local_1d0.ptr + lVar9 * 4 + lVar7));
        lVar9 = lVar9 + 1;
      } while (lVar9 != 9);
      lVar4 = lVar4 + 1;
      lVar7 = lVar7 + 0x24;
      lVar3 = lVar3 + 0x100000000;
    } while (lVar4 != 3);
    local_210.alloc.memoryResource = (memory_resource *)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"Y","");
    requestedChannels.n = 1;
    requestedChannels.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_210;
    pbrt::Image::GetChannelDesc(&local_1b0,&local_148,requestedChannels);
    if ((anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
         *)local_210.alloc.memoryResource != &local_210.field_2) {
      operator_delete(local_210.alloc.memoryResource,local_210.field_2._0_8_ + 1);
    }
    local_240.alloc.memoryResource._0_1_ = local_1b0.offset.nStored != 0;
    local_240.ptr = (float *)0x0;
    if (local_1b0.offset.nStored == 0) {
      testing::Message::Message((Message *)&local_260);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&local_210,(internal *)&local_240,(AssertionResult *)"bool(yDesc)",
                 "false","true",(char *)encoding);
      testing::internal::AssertHelper::AssertHelper
                (&local_250,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                 ,0x74,(char *)local_210.alloc.memoryResource);
      testing::internal::AssertHelper::operator=(&local_250,(Message *)&local_260);
      testing::internal::AssertHelper::~AssertHelper(&local_250);
      if ((anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
           *)local_210.alloc.memoryResource != &local_210.field_2) {
        operator_delete(local_210.alloc.memoryResource,local_210.field_2._0_8_ + 1);
      }
      if (local_260 != (long *)0x0) {
        bVar10 = testing::internal::IsTrue(true);
        if ((bVar10) && (local_260 != (long *)0x0)) {
          (**(code **)(*local_260 + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_240.ptr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         );
    local_240.alloc.memoryResource = (memory_resource *)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"Y0L0","");
    requestedChannels_00.n = 1;
    requestedChannels_00.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_240;
    pbrt::Image::GetChannelDesc((ImageChannelDesc *)&local_210,&local_148,requestedChannels_00);
    bVar10 = (long *)local_210.nStored == (long *)0x0;
    local_210.nStored = 0;
    local_260 = (long *)CONCAT71(local_260._1_7_,bVar10);
    local_258.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    (**(code **)(*(long *)&(local_210.alloc.memoryResource)->_vptr_memory_resource + 0x18))
              (local_210.alloc.memoryResource,local_210.ptr,local_210.nAlloc << 2);
    if ((anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
         *)local_240.alloc.memoryResource != &local_240.field_2) {
      operator_delete(local_240.alloc.memoryResource,local_240.field_2._0_8_ + 1);
    }
    if (local_260._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_240);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&local_210,(internal *)&local_260,
                 (AssertionResult *)"bool(image.GetChannelDesc({\"Y0L0\"}))","true","false",
                 (char *)encoding);
      testing::internal::AssertHelper::AssertHelper
                (&local_250,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                 ,0x75,(char *)local_210.alloc.memoryResource);
      testing::internal::AssertHelper::operator=(&local_250,(Message *)&local_240);
      testing::internal::AssertHelper::~AssertHelper(&local_250);
      if ((anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
           *)local_210.alloc.memoryResource != &local_210.field_2) {
        operator_delete(local_210.alloc.memoryResource,local_210.field_2._0_8_ + 1);
      }
      if ((anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
           *)local_240.alloc.memoryResource !=
          (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
           *)0x0) {
        bVar10 = testing::internal::IsTrue(true);
        if ((bVar10) &&
           ((anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
             *)local_240.alloc.memoryResource !=
            (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
             *)0x0)) {
          (**(code **)(*(long *)&(local_240.alloc.memoryResource)->_vptr_memory_resource + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_258,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_180 = 0;
    lVar3 = 0;
    lVar4 = 0;
    do {
      lVar7 = 0;
      local_1e0 = lVar3;
      local_170 = lVar4;
      local_168 = lVar3;
      do {
        p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_180 + lVar7);
        local_244 = pbrt::Image::GetChannel(&local_148,p,0,(WrapMode2D)0x200000002);
        pbrt::Image::GetChannels
                  ((ImageChannelValues *)&local_210,&local_148,p,(WrapMode2D)0x200000002);
        local_250.data_._0_4_ = 1;
        local_260 = (long *)local_210.nStored;
        testing::internal::CmpHelperEQ<int,unsigned_long>
                  ((internal *)&local_240,"1","cv.size()",(int *)&local_250,
                   (unsigned_long *)&local_260);
        if ((char)local_240.alloc.memoryResource == '\0') {
          testing::Message::Message((Message *)&local_260);
          pcVar5 = "";
          if (local_240.ptr != (float *)0x0) {
            pcVar5 = *(char **)local_240.ptr;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_250,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0x7b,pcVar5);
          testing::internal::AssertHelper::operator=(&local_250,(Message *)&local_260);
          testing::internal::AssertHelper::~AssertHelper(&local_250);
          if (local_260 != (long *)0x0) {
            bVar10 = testing::internal::IsTrue(true);
            if ((bVar10) && (local_260 != (long *)0x0)) {
              (**(code **)(*local_260 + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_240.ptr,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        paVar6 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                  *)local_210.ptr;
        if ((anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
             *)local_210.ptr ==
            (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
             *)0x0) {
          paVar6 = &local_210.field_2;
        }
        testing::internal::CmpHelperEQ<float,float>
                  ((internal *)&local_240,"v","cv[0]",&local_244,paVar6->fixed);
        if ((char)local_240.alloc.memoryResource == '\0') {
          testing::Message::Message((Message *)&local_260);
          pcVar5 = "";
          if (local_240.ptr != (float *)0x0) {
            pcVar5 = *(char **)local_240.ptr;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_250,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0x7c,pcVar5);
          testing::internal::AssertHelper::operator=(&local_250,(Message *)&local_260);
          testing::internal::AssertHelper::~AssertHelper(&local_250);
          if (local_260 != (long *)0x0) {
            bVar10 = testing::internal::IsTrue(true);
            if ((bVar10) && (local_260 != (long *)0x0)) {
              (**(code **)(*local_260 + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_240.ptr,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        pbrt::Image::GetChannels
                  ((ImageChannelValues *)&local_240,&local_148,p,&local_1b0,(WrapMode2D)0x200000002)
        ;
        pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                  (&local_210,&local_240);
        local_240.nStored = 0;
        (**(code **)(*(long *)&(local_240.alloc.memoryResource)->_vptr_memory_resource + 0x18))
                  (local_240.alloc.memoryResource,local_240.ptr,local_240.nAlloc << 2,4);
        local_250.data_._0_4_ = 1;
        local_260 = (long *)local_210.nStored;
        testing::internal::CmpHelperEQ<int,unsigned_long>
                  ((internal *)&local_240,"1","cv.size()",(int *)&local_250,
                   (unsigned_long *)&local_260);
        if ((char)local_240.alloc.memoryResource == '\0') {
          testing::Message::Message((Message *)&local_260);
          pcVar5 = "";
          if (local_240.ptr != (float *)0x0) {
            pcVar5 = *(char **)local_240.ptr;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_250,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0x7f,pcVar5);
          testing::internal::AssertHelper::operator=(&local_250,(Message *)&local_260);
          testing::internal::AssertHelper::~AssertHelper(&local_250);
          if (local_260 != (long *)0x0) {
            bVar10 = testing::internal::IsTrue(true);
            if ((bVar10) && (local_260 != (long *)0x0)) {
              (**(code **)(*local_260 + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_240.ptr,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        paVar6 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                  *)local_210.ptr;
        if ((anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
             *)local_210.ptr ==
            (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
             *)0x0) {
          paVar6 = &local_210.field_2;
        }
        testing::internal::CmpHelperEQ<float,float>
                  ((internal *)&local_240,"v","cv[0]",&local_244,paVar6->fixed);
        if ((char)local_240.alloc.memoryResource == '\0') {
          testing::Message::Message((Message *)&local_260);
          pcVar5 = "";
          if (local_240.ptr != (float *)0x0) {
            pcVar5 = *(char **)local_240.ptr;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_250,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0x80,pcVar5);
          testing::internal::AssertHelper::operator=(&local_250,(Message *)&local_260);
          testing::internal::AssertHelper::~AssertHelper(&local_250);
          if (local_260 != (long *)0x0) {
            bVar10 = testing::internal::IsTrue(true);
            if ((bVar10) && (local_260 != (long *)0x0)) {
              (**(code **)(*local_260 + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_240.ptr,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        if (local_1d4 == U256) {
          local_250.data_._0_4_ = 0x3b00c24b;
          auVar11 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),
                               ZEXT416(*(uint *)((long)local_1d0.ptr + local_1e0)));
          uVar1 = vcmpss_avx512f(ZEXT416(*(uint *)((long)local_1d0.ptr + local_1e0)),
                                 ZEXT816(0) << 0x40,1);
          auVar2._8_4_ = 0x7fffffff;
          auVar2._0_8_ = 0x7fffffff7fffffff;
          auVar2._12_4_ = 0x7fffffff;
          auVar11 = vandps_avx512vl(ZEXT416((uint)(local_244 -
                                                  (float)((uint)!(bool)((byte)uVar1 & 1) *
                                                         auVar11._0_4_))),auVar2);
          local_260 = (long *)CONCAT44(local_260._4_4_,auVar11._0_4_);
          testing::internal::CmpHelperLT<float,float>
                    ((internal *)&local_240,"std::abs(v - Clamp(yPixels[y * res[0] + x], 0, 1))",
                     "0.501f / 255.f",(float *)&local_260,(float *)&local_250);
          if ((char)local_240.alloc.memoryResource == '\0') {
            testing::Message::Message((Message *)&local_260);
            std::ostream::_M_insert<double>((double)local_244);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_260 + 2)," vs ",4);
            auVar11 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),
                                 ZEXT416(*(uint *)((long)local_1d0.ptr + local_1e0)));
            uVar1 = vcmpss_avx512f(ZEXT416(*(uint *)((long)local_1d0.ptr + local_1e0)),
                                   ZEXT816(0) << 0x40,1);
            std::ostream::_M_insert<double>
                      ((double)(float)((uint)!(bool)((byte)uVar1 & 1) * auVar11._0_4_));
            pcVar5 = "";
            if (local_240.ptr != (float *)0x0) {
              pcVar5 = *(char **)local_240.ptr;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_250,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                       ,0x84,pcVar5);
            testing::internal::AssertHelper::operator=(&local_250,(Message *)&local_260);
            testing::internal::AssertHelper::~AssertHelper(&local_250);
            if (local_260 != (long *)0x0) {
              bVar10 = testing::internal::IsTrue(true);
              if ((bVar10) && (local_260 != (long *)0x0)) {
                (**(code **)(*local_260 + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_240.ptr,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
        else {
          FVar12 = modelQuantization(*(Float *)((long)local_1d0.ptr + local_1e0),local_1d4);
          local_260 = (long *)CONCAT44(local_260._4_4_,FVar12);
          testing::internal::CmpHelperEQ<float,float>
                    ((internal *)&local_240,"v","modelQuantization(yPixels[y * res[0] + x], format)"
                     ,&local_244,(float *)&local_260);
          if ((char)local_240.alloc.memoryResource == '\0') {
            testing::Message::Message((Message *)&local_260);
            pcVar5 = "";
            if (local_240.ptr != (float *)0x0) {
              pcVar5 = *(char **)local_240.ptr;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_250,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                       ,0x87,pcVar5);
            testing::internal::AssertHelper::operator=(&local_250,(Message *)&local_260);
            testing::internal::AssertHelper::~AssertHelper(&local_250);
            if (local_260 != (long *)0x0) {
              bVar10 = testing::internal::IsTrue(true);
              if ((bVar10) && (local_260 != (long *)0x0)) {
                (**(code **)(*local_260 + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_240.ptr,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
        local_210.nStored = 0;
        (**(code **)(*(long *)&(local_210.alloc.memoryResource)->_vptr_memory_resource + 0x18))
                  (local_210.alloc.memoryResource,local_210.ptr,local_210.nAlloc << 2,4);
        local_1e0 = local_1e0 + 4;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 9);
      local_180 = local_180 + 0x100000000;
      lVar4 = local_170 + 1;
      lVar3 = local_168 + 0x24;
    } while (lVar4 != 3);
    local_1b0.offset.nStored = 0;
    (**(code **)(*(long *)local_1b0.offset.alloc.memoryResource + 0x18))
              (local_1b0.offset.alloc.memoryResource,local_1b0.offset.ptr,
               local_1b0.offset.nAlloc << 2,4);
    local_148.p32.nStored = 0;
    (*(local_148.p32.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_148.p32.alloc.memoryResource,local_148.p32.ptr,local_148.p32.nAlloc << 2,4);
    local_148.p16.nStored = 0;
    (*(local_148.p16.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_148.p16.alloc.memoryResource,local_148.p16.ptr,local_148.p16.nAlloc * 2,2);
    local_148.p8.nStored = 0;
    (*(local_148.p8.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_148.p8.alloc.memoryResource,local_148.p8.ptr,local_148.p8.nAlloc,1);
    pbrt::
    InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~InlinedVector(&local_148.channelNames);
    lVar3 = local_178 + 4;
  } while (lVar3 != 0xc);
  local_1d0.nStored = 0;
  (*(local_1d0.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_1d0.alloc.memoryResource,local_1d0.ptr,local_1d0.nAlloc << 2,4);
  return;
}

Assistant:

TEST(Image, GetSetY) {
    Point2i res(9, 3);
    pstd::vector<float> yPixels = GetFloatPixels(res, 1);

    for (auto format : {PixelFormat::U256, PixelFormat::Half, PixelFormat::Float}) {
        Image image(format, res, {"Y"}, ColorEncodingHandle::Linear);
        for (int y = 0; y < res[1]; ++y)
            for (int x = 0; x < res[0]; ++x) {
                image.SetChannel({x, y}, 0, yPixels[y * res[0] + x]);
            }

        ImageChannelDesc yDesc = image.GetChannelDesc({"Y"});
        EXPECT_TRUE(bool(yDesc));
        EXPECT_FALSE(bool(image.GetChannelDesc({"Y0L0"})));

        for (int y = 0; y < res[1]; ++y)
            for (int x = 0; x < res[0]; ++x) {
                Float v = image.GetChannel({x, y}, 0);
                ImageChannelValues cv = image.GetChannels({x, y});
                EXPECT_EQ(1, cv.size());
                EXPECT_EQ(v, cv[0]);

                cv = image.GetChannels({x, y}, yDesc);
                EXPECT_EQ(1, cv.size());
                EXPECT_EQ(v, cv[0]);

                if (format == PixelFormat::U256)
                    EXPECT_LT(std::abs(v - Clamp(yPixels[y * res[0] + x], 0, 1)),
                              0.501f / 255.f)
                        << v << " vs " << Clamp(yPixels[y * res[0] + x], 0, 1);
                else
                    EXPECT_EQ(v, modelQuantization(yPixels[y * res[0] + x], format));
            }
    }
}